

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace.cpp
# Opt level: O3

string * duckdb::StackTrace::ResolveStacktraceSymbols
                   (string *__return_storage_ptr__,string *pointers)

{
  _Head_base<0UL,_void_**,_false> _Var1;
  int iVar2;
  reference str;
  void *pvVar3;
  type ppvVar4;
  long lVar5;
  size_type __n;
  unsigned_long uVar6;
  ulong *puVar7;
  ulong uVar8;
  size_type sVar9;
  pointer pbVar10;
  int status;
  string mangled_symbol;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  splits;
  string result;
  allocator local_139;
  ulong local_138;
  ulong *local_130;
  ulong local_128;
  undefined1 local_120;
  undefined7 uStack_11f;
  undefined8 uStack_118;
  ulong *local_110;
  ulong local_108;
  ulong local_100;
  undefined8 uStack_f8;
  pointer local_f0;
  _Head_base<0UL,_void_**,_false> local_e8;
  int local_dc;
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  string local_b8;
  string *local_98;
  ulong local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_88;
  ulong *local_70;
  ulong local_68;
  ulong local_60;
  undefined8 uStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_98 = __return_storage_ptr__;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,";","");
  StringUtil::Split(&local_88,pointers,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  local_138 = (long)local_88.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_88.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
  local_e8._M_head_impl =
       (void **)operator_new__(-(ulong)(local_138 >> 0x3d != 0) |
                               (long)local_88.
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_88.
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 2);
  pbVar10 = local_88.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_88.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_88.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_f0 = local_88.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    sVar9 = local_138 + (local_138 == 0);
    __n = 0;
    do {
      str = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ::operator[](&local_88,__n);
      pvVar3 = (void *)StringUtil::ToUnsigned((string *)str);
      ppvVar4 = unique_ptr<void_*[],_std::default_delete<void_*[]>,_true>::operator[]
                          ((unique_ptr<void_*[],_std::default_delete<void_*[]>,_true> *)&local_e8,
                           __n);
      *ppvVar4 = pvVar3;
      __n = __n + 1;
      pbVar10 = local_f0;
    } while (sVar9 != __n);
  }
  _Var1._M_head_impl = local_e8._M_head_impl;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  iVar2 = NumericCastImpl<int,_unsigned_long,_false>::Convert(local_138);
  local_f0 = (pointer)backtrace_symbols(_Var1._M_head_impl,iVar2);
  if (local_88.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar10) {
    local_138 = local_138 + (local_138 == 0);
    uVar6 = 0;
    do {
      ::std::__cxx11::string::string
                ((string *)&local_130,*(char **)((long)local_f0 + uVar6 * 8),&local_139);
      uVar8 = 0;
      if (local_128 == 0) {
LAB_013ef928:
        if (uVar8 < local_128) {
          lVar5 = 0;
          puVar7 = local_130;
          do {
            if (((ulong)*(byte *)((long)puVar7 + uVar8) < 0x2c) &&
               ((0xa0100003e00U >> ((ulong)*(byte *)((long)puVar7 + uVar8) & 0x3f) & 1) != 0)) {
              if (uVar8 < uVar8 - lVar5) {
                local_90 = uVar8 - lVar5;
                ::std::__cxx11::string::substr((ulong)&local_b8,(ulong)&local_130);
                pvVar3 = (void *)__cxa_demangle(local_b8._M_dataplus._M_p,0,0,&local_dc);
                if (local_dc == 0 && pvVar3 != (void *)0x0) {
                  local_108 = 0;
                  local_100 = local_100 & 0xffffffffffffff00;
                  local_110 = &local_100;
                  ::std::__cxx11::string::substr((ulong)local_d8,(ulong)&local_130);
                  ::std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_d8[0]);
                  if (local_d8[0] != local_c8) {
                    operator_delete(local_d8[0]);
                  }
                  ::std::__cxx11::string::append((char *)&local_110);
                  ::std::__cxx11::string::substr((ulong)local_d8,(ulong)&local_130);
                  ::std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_d8[0]);
                  if (local_d8[0] != local_c8) {
                    operator_delete(local_d8[0]);
                  }
                  free(pvVar3);
                }
                else {
                  if (local_130 == (ulong *)&local_120) {
                    uStack_f8 = uStack_118;
                    local_110 = &local_100;
                  }
                  else {
                    local_110 = local_130;
                  }
                  local_100 = CONCAT71(uStack_11f,local_120);
                  local_108 = local_128;
                  local_128 = 0;
                  local_120 = 0;
                  local_130 = (ulong *)&local_120;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                  operator_delete(local_b8._M_dataplus._M_p);
                }
                goto LAB_013efac2;
              }
              break;
            }
            lVar5 = lVar5 + -1;
            puVar7 = (ulong *)((long)puVar7 + 1);
          } while (uVar8 - local_128 != lVar5);
        }
      }
      else {
        do {
          if (*(char *)((long)local_130 + uVar8) == '_') goto LAB_013ef928;
          uVar8 = uVar8 + 1;
        } while (local_128 != uVar8);
      }
      local_110 = local_130;
      if (local_130 == (ulong *)&local_120) {
        uStack_f8 = uStack_118;
        local_110 = &local_100;
      }
      local_100 = CONCAT71(uStack_11f,local_120);
      local_108 = local_128;
      local_128 = 0;
      local_120 = 0;
      local_130 = (ulong *)&local_120;
LAB_013efac2:
      if (local_110 == &local_100) {
        uStack_58 = uStack_f8;
        local_110 = &local_60;
      }
      local_60 = local_100;
      local_68 = local_108;
      local_108 = 0;
      local_100 = local_100 & 0xffffffffffffff00;
      local_70 = local_110;
      local_110 = &local_100;
      ::std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70);
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_110 != &local_100) {
        operator_delete(local_110);
      }
      if (local_130 != (ulong *)&local_120) {
        operator_delete(local_130);
      }
      ::std::__cxx11::string::append((char *)&local_50);
      uVar6 = uVar6 + 1;
    } while (uVar6 != local_138);
  }
  free(local_f0);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                   anon_var_dwarf_4ed1874 + 8,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_e8._M_head_impl != (void **)0x0) {
    operator_delete__(local_e8._M_head_impl);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_88);
  return local_98;
}

Assistant:

string StackTrace::ResolveStacktraceSymbols(const string &pointers) {
	auto splits = StringUtil::Split(pointers, ";");
	idx_t frame_count = splits.size();
	auto callstack = unique_ptr<void *[]>(new void *[frame_count]);
	for (idx_t i = 0; i < frame_count; i++) {
		callstack[i] = cast_uint64_to_pointer(StringUtil::ToUnsigned(splits[i]));
	}
	string result;
	char **strs = backtrace_symbols(callstack.get(), NumericCast<int>(frame_count));
	for (idx_t i = 0; i < frame_count; i++) {
		result += CleanupStackTrace(UnmangleSymbol(strs[i]));
		result += "\n";
	}
	free(reinterpret_cast<void *>(strs));
	return "\n" + result;
}